

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

bool __thiscall cbtSingleRayCallback::process(cbtSingleRayCallback *this,cbtBroadphaseProxy *proxy)

{
  float fVar1;
  RayResultCallback *pRVar2;
  cbtCollisionObject *pcVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  cbtCollisionObjectWrapper local_38;
  
  pRVar2 = this->m_resultCallback;
  fVar1 = pRVar2->m_closestHitFraction;
  auVar6 = ZEXT816(0) << 0x40;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    pcVar3 = (cbtCollisionObject *)proxy->m_clientObject;
    iVar5 = (*pRVar2->_vptr_RayResultCallback[2])(pRVar2,pcVar3->m_broadphaseHandle);
    auVar6 = ZEXT816(0) << 0x40;
    if ((char)iVar5 != '\0') {
      local_38.m_shape = pcVar3->m_collisionShape;
      local_38.m_parent = (cbtCollisionObjectWrapper *)0x0;
      local_38.m_worldTransform = &pcVar3->m_worldTransform;
      local_38.m_partId = -1;
      local_38.m_index = -1;
      local_38.m_collisionObject = pcVar3;
      cbtCollisionWorld::rayTestSingleInternal
                (&this->m_rayFromTrans,&this->m_rayToTrans,&local_38,this->m_resultCallback);
      auVar6 = ZEXT816(0) << 0x40;
    }
  }
  uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar6,4);
  return (bool)((byte)uVar4 & 1);
}

Assistant:

virtual bool process(const cbtBroadphaseProxy* proxy)
	{
		///terminate further ray tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == cbtScalar(0.f))
			return false;

		cbtCollisionObject* collisionObject = (cbtCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if (m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			//cbtVector3 collisionObjectAabbMin,collisionObjectAabbMax;
#if 0
#ifdef RECALCULATE_AABB
			cbtVector3 collisionObjectAabbMin,collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(),collisionObjectAabbMin,collisionObjectAabbMax);
#else
			//getBroadphase()->getAabb(collisionObject->getBroadphaseHandle(),collisionObjectAabbMin,collisionObjectAabbMax);
			const cbtVector3& collisionObjectAabbMin = collisionObject->getBroadphaseHandle()->m_aabbMin;
			const cbtVector3& collisionObjectAabbMax = collisionObject->getBroadphaseHandle()->m_aabbMax;
#endif
#endif
			//cbtScalar hitLambda = m_resultCallback.m_closestHitFraction;
			//culling already done by broadphase
			//if (cbtRayAabb(m_rayFromWorld,m_rayToWorld,collisionObjectAabbMin,collisionObjectAabbMax,hitLambda,m_hitNormal))
			{
				m_world->rayTestSingle(m_rayFromTrans, m_rayToTrans,
									   collisionObject,
									   collisionObject->getCollisionShape(),
									   collisionObject->getWorldTransform(),
									   m_resultCallback);
			}
		}
		return true;
	}